

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::enterDirectory(QFileDialogPrivate *this,QModelIndex *index)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  QStyle *pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QString local_98;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QAbstractItemModel *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = -0x55555556;
  iStack_74 = -0x55555556;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  pQVar1 = (QAbstractItemModel *)this->proxyModel;
  if (((index->m).ptr == pQVar1) && (pQVar1 != (QAbstractItemModel *)0x0)) {
    (**(code **)(*(long *)pQVar1 + 400))(&local_78,pQVar1,index);
  }
  else {
    local_68 = (index->m).ptr;
    local_78 = index->r;
    iStack_74 = index->c;
    uStack_70 = (undefined4)index->i;
    uStack_6c = *(undefined4 *)((long)&index->i + 4);
  }
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d._0_4_ = 0xaaaaaaaa;
  local_98.d.d._4_4_ = 0xaaaaaaaa;
  local_98.d.ptr._0_4_ = 0xaaaaaaaa;
  local_98.d.ptr._4_4_ = 0xaaaaaaaa;
  if (local_68 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = 0;
    local_40 = 2;
  }
  else {
    (**(code **)(*(long *)local_68 + 0x90))(&local_58,local_68,&local_78,0x101);
  }
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_58);
  if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
    cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
    if (cVar3 == '\0') {
      pQVar6 = QWidget::style(this_00);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))
                        (pQVar6,0x3d,0,((this->qFileDialogUi).d)->treeView,0);
      if (iVar4 != 0) {
        iVar4 = QFileDialogOptions::fileMode();
        if (iVar4 == 3) {
          uVar5 = QGuiApplication::keyboardModifiers();
          if ((uVar5 >> 0x1a & 1) != 0) goto LAB_004eaa3c;
        }
      }
      pQVar1 = (index->m).ptr;
      uVar7 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index);
      if ((uVar7 & 0x20) != 0) {
        (**(code **)(*(long *)this_00 + 0x1b8))(this_00);
      }
      goto LAB_004eaa3c;
    }
  }
  iVar4 = QFileDialogOptions::fileMode();
  QFileDialog::setDirectory((QFileDialog *)this_00,&local_98);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = &local_98;
  QMetaObject::activate(&this_00->super_QObject,&QFileDialog::staticMetaObject,3,&local_58.shared);
  if (iVar4 == 2) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = 0;
    QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,
                       (QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    QLineEdit::clear(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  }
LAB_004eaa3c:
  piVar2 = (int *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::enterDirectory(const QModelIndex &index)
{
    Q_Q(QFileDialog);
    // My Computer or a directory
    QModelIndex sourceIndex = index.model() == proxyModel ? mapToSource(index) : index;
    QString path = sourceIndex.data(QFileSystemModel::FilePathRole).toString();
    if (path.isEmpty() || model->isDir(sourceIndex)) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        q->setDirectory(path);
        emit q->directoryEntered(path);
        if (fileMode == QFileDialog::Directory) {
            // ### find out why you have to do both of these.
            lineEdit()->setText(QString());
            lineEdit()->clear();
        }
    } else {
        // Do not accept when shift-clicking to multi-select a file in environments with single-click-activation (KDE)
        if ((!q->style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, qFileDialogUi->treeView)
             || q->fileMode() != QFileDialog::ExistingFiles || !(QGuiApplication::keyboardModifiers() & Qt::CTRL))
            && index.model()->flags(index) & Qt::ItemIsEnabled) {
            q->accept();
        }
    }
}